

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O2

void __thiscall
Iir::BandPassTransform::BandPassTransform
          (BandPassTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  int pairIndex;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar3;
  int pairIndex_00;
  double dVar4;
  double dVar5;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t c_02;
  ComplexPair z1;
  ComplexPair p1;
  undefined8 extraout_RDX_00;
  
  this->ab = 0.0;
  this->ab_2 = 0.0;
  this->a2 = 0.0;
  this->b2 = 0.0;
  this->a = 0.0;
  this->b = 0.0;
  this->wc = 0.0;
  this->wc2 = 0.0;
  if (0.5 <= fc) {
    throw_invalid_argument("The cutoff frequency needs to be below the Nyquist frequency.");
  }
  if (fc < 0.0) {
    throw_invalid_argument("Cutoff frequency is negative.");
  }
  digital->m_numPoles = 0;
  dVar4 = fc * 6.283185307179586 + fw * 6.283185307179586 * -0.5;
  this->wc2 = dVar4;
  dVar5 = fw * 6.283185307179586 + dVar4;
  this->wc = dVar5;
  if (dVar4 < 1e-08) {
    this->wc2 = 1e-08;
    dVar4 = 1e-08;
  }
  if (3.141592643589793 < dVar5) {
    this->wc = 3.141592643589793;
    dVar5 = 3.141592643589793;
  }
  dVar4 = cos((dVar5 + dVar4) * 0.5);
  dVar5 = cos((this->wc - this->wc2) * 0.5);
  this->a = dVar4 / dVar5;
  dVar5 = tan((this->wc - this->wc2) * 0.5);
  dVar5 = 1.0 / dVar5;
  this->b = dVar5;
  dVar4 = this->a;
  this->a2 = dVar4 * dVar4;
  this->b2 = dVar5 * dVar5;
  dVar5 = dVar5 * dVar4;
  this->ab = dVar5;
  this->ab_2 = dVar5 + dVar5;
  uVar1 = analog->m_numPoles;
  uVar2 = 2;
  pairIndex = (int)uVar1 / 2;
  pairIndex_00 = 0;
  iVar3 = pairIndex;
  if (pairIndex < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != pairIndex_00; pairIndex_00 = pairIndex_00 + 1) {
    LayoutBase::getPair(analog,pairIndex_00);
    c._M_value._8_8_ = uVar2;
    c._M_value._0_8_ = extraout_RDX;
    transform(&p1,this,c);
    c_00._M_value._8_8_ = uVar2;
    c_00._M_value._0_8_ = extraout_RDX_00;
    transform(&z1,this,c_00);
    LayoutBase::addPoleZeroConjugatePairs(digital,(complex_t *)&p1,(complex_t *)&z1);
    LayoutBase::addPoleZeroConjugatePairs
              (digital,&p1.super_complex_pair_t.second,&z1.super_complex_pair_t.second);
  }
  if ((uVar1 & 1) != 0) {
    LayoutBase::getPair(analog,pairIndex);
    c_01._M_value._8_8_ = uVar2;
    c_01._M_value._0_8_ = extraout_RDX_01;
    transform(&p1,this,c_01);
    LayoutBase::getPair(analog,pairIndex);
    c_02._M_value._8_8_ = uVar2;
    c_02._M_value._0_8_ = extraout_RDX_02;
    transform(&z1,this,c_02);
    LayoutBase::add(digital,&p1,&z1);
  }
  dVar4 = analog->m_normalW;
  dVar5 = tan((this->wc + dVar4) * 0.5);
  dVar4 = tan((dVar4 + this->wc2) * 0.5);
  dVar4 = dVar4 * dVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = atan(dVar4);
  dVar4 = analog->m_normalGain;
  digital->m_normalW = dVar5 + dVar5;
  digital->m_normalGain = dVar4;
  return;
}

Assistant:

BandPassTransform::BandPassTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	// pre-calcs
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// what is this crap?
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a =     cos ((wc + wc2) * 0.5) /
		cos ((wc - wc2) * 0.5);
	b = 1 / tan ((wc - wc2) * 0.5);
	a2 = a * a;
	b2 = b * b;
	ab = a * b;
	ab_2 = 2 * ab;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p1 = transform (pair.poles.first);
		ComplexPair z1 = transform (pair.zeros.first);
		
		digital.addPoleZeroConjugatePairs (p1.first, z1.first);
		digital.addPoleZeroConjugatePairs (p1.second, z1.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	double wn = analog.getNormalW();
	digital.setNormal (2 * atan (sqrt (tan ((wc + wn)* 0.5) * tan((wc2 + wn)* 0.5))),
			   analog.getNormalGain());
}